

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness
          (DescriptorBuilder *this,string_view message_name,DescriptorProto *message,
          Descriptor *descriptor,bool use_custom_names)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  undefined8 uVar1;
  bool bVar2;
  FeatureSet_JsonFormat FVar3;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_00;
  pointer prVar4;
  FeatureSet *this_01;
  char *pcVar5;
  size_t sVar6;
  byte local_1f1;
  bool local_1d9;
  VoidPtr local_1a8;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_1a0;
  size_t local_198;
  char *pcStack_190;
  VoidPtr local_188;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_180;
  size_t local_178;
  char *pcStack_170;
  byte local_159;
  undefined1 auStack_158 [7];
  bool involves_default;
  anon_class_24_3_4f82d86e make_error;
  JsonNameDetails *match;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>::iterator,_bool>
  it_inserted;
  VoidPtr local_118;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_110;
  size_t local_108;
  char *pcStack_100;
  undefined1 local_f0 [8];
  anon_class_16_2_d7801031 make_error_1;
  string local_d8;
  undefined1 local_b8 [8];
  JsonNameDetails details;
  FieldDescriptorProto *field;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *__range2;
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
  name_to_field;
  bool use_custom_names_local;
  Descriptor *descriptor_local;
  DescriptorProto *message_local;
  DescriptorBuilder *this_local;
  string_view message_name_local;
  
  pcVar5 = message_name._M_str;
  sVar6 = message_name._M_len;
  name_to_field.
  super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
  .
  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.soo_data[0xf] = use_custom_names;
  absl::lts_20240722::
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
  ::flat_hash_map((flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                   *)&__range2);
  this_00 = DescriptorProto::field(message);
  __end2 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::begin(this_00);
  field = (FieldDescriptorProto *)
          RepeatedPtrField<google::protobuf::FieldDescriptorProto>::end(this_00);
  while (bVar2 = internal::operator!=(&__end2,(iterator *)&field), bVar2) {
    details._40_8_ =
         internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::operator*
                   (&__end2);
    anon_unknown_23::GetJsonNameDetails
              ((JsonNameDetails *)local_b8,(FieldDescriptorProto *)details._40_8_,
               (bool)(name_to_field.
                      super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                      .
                      super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                      .settings_.
                      super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                      .
                      super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                      .value.heap_or_soo_.soo_data[0xf] & 1));
    make_error_1.details._7_1_ = 0;
    local_1d9 = false;
    if ((details.orig_name.field_2._M_local_buf[8] & 1U) != 0) {
      std::__cxx11::string::string((string *)&local_d8,(string *)&details);
      make_error_1.details._7_1_ = 1;
      local_1d9 = anon_unknown_23::JsonNameLooksLikeExtension(&local_d8);
    }
    if ((make_error_1.details._7_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_d8);
    }
    uVar1 = details._40_8_;
    if (local_1d9 == false) {
      absl::lts_20240722::container_internal::
      raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
      ::
      try_emplace<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails_&,_0>
                ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>::iterator,_bool>
                  *)&match,
                 (raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                  *)&__range2,(key_arg<std::__cxx11::basic_string<char>_> *)&details,
                 (JsonNameDetails *)local_b8);
      if ((it_inserted.first.field_1._0_1_ & 1) == 0) {
        prVar4 = absl::lts_20240722::container_internal::
                 raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                 ::iterator::operator->((iterator *)&match);
        make_error.field = (FieldDescriptorProto *)&prVar4->second;
        if ((((name_to_field.
               super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
               .
               super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
               .settings_.
               super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
               value.heap_or_soo_.soo_data[0xf] & 1) == 0) ||
            ((details.orig_name.field_2._M_local_buf[8] & 1U) != 0)) ||
           (((prVar4->second).is_custom & 1U) != 0)) {
          _auStack_158 = (JsonNameDetails *)local_b8;
          make_error.match = (JsonNameDetails *)details._40_8_;
          local_1f1 = 1;
          if ((details.orig_name.field_2._M_local_buf[8] & 1U) != 0) {
            local_1f1 = (prVar4->second).is_custom ^ 0xff;
          }
          local_159 = local_1f1 & 1;
          make_error.details = (JsonNameDetails *)make_error.field;
          this_01 = Descriptor::features(descriptor);
          FVar3 = FeatureSet::json_format(this_01);
          uVar1 = details._40_8_;
          if ((FVar3 == FeatureSet_JsonFormat_LEGACY_BEST_EFFORT) && ((local_159 & 1) != 0)) {
            local_178 = sVar6;
            pcStack_170 = pcVar5;
            absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
            FunctionRef<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,void>
                      ((FunctionRef<std::__cxx11::string()> *)&local_188,
                       (anon_class_24_3_4f82d86e *)auStack_158);
            element_name_00._M_str = pcStack_170;
            element_name_00._M_len = local_178;
            make_error_01.invoker_ = p_Stack_180;
            make_error_01.ptr_.obj = local_188.obj;
            AddWarning(this,element_name_00,(Message *)uVar1,NAME,make_error_01);
          }
          else {
            local_198 = sVar6;
            pcStack_190 = pcVar5;
            absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
            FunctionRef<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,void>
                      ((FunctionRef<std::__cxx11::string()> *)&local_1a8,
                       (anon_class_24_3_4f82d86e *)auStack_158);
            element_name._M_str = pcStack_190;
            element_name._M_len = local_198;
            make_error_02.invoker_ = p_Stack_1a0;
            make_error_02.ptr_.obj = local_1a8.obj;
            AddError(this,element_name,(Message *)uVar1,NAME,make_error_02);
          }
          it_inserted._20_4_ = 0;
        }
        else {
          it_inserted._20_4_ = 3;
        }
      }
      else {
        it_inserted._20_4_ = 3;
      }
    }
    else {
      local_f0 = (undefined1  [8])details._40_8_;
      make_error_1.field = (FieldDescriptorProto *)local_b8;
      local_108 = sVar6;
      pcStack_100 = pcVar5;
      absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__0,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_118,
                 (anon_class_16_2_d7801031 *)local_f0);
      element_name_01._M_str = pcStack_100;
      element_name_01._M_len = local_108;
      make_error_00.invoker_ = p_Stack_110;
      make_error_00.ptr_.obj = local_118.obj;
      AddError(this,element_name_01,(Message *)uVar1,NAME,make_error_00);
      it_inserted._20_4_ = 3;
    }
    anon_unknown_23::JsonNameDetails::~JsonNameDetails((JsonNameDetails *)local_b8);
    internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::operator++(&__end2)
    ;
  }
  absl::lts_20240722::
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
  ::~flat_hash_map((flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                    *)&__range2);
  return;
}

Assistant:

void DescriptorBuilder::CheckFieldJsonNameUniqueness(
    const absl::string_view message_name, const DescriptorProto& message,
    const Descriptor* descriptor, bool use_custom_names) {
  absl::flat_hash_map<std::string, JsonNameDetails> name_to_field;
  for (const FieldDescriptorProto& field : message.field()) {
    JsonNameDetails details = GetJsonNameDetails(&field, use_custom_names);
    if (details.is_custom && JsonNameLooksLikeExtension(details.orig_name)) {
      auto make_error = [&] {
        return absl::StrFormat(
            "The custom JSON name of field \"%s\" (\"%s\") is invalid: "
            "JSON names may not start with '[' and end with ']'.",
            field.name(), details.orig_name);
      };
      AddError(message_name, field, DescriptorPool::ErrorCollector::NAME,
               make_error);
      continue;
    }
    auto it_inserted = name_to_field.try_emplace(details.orig_name, details);
    if (it_inserted.second) {
      continue;
    }
    JsonNameDetails& match = it_inserted.first->second;
    if (use_custom_names && !details.is_custom && !match.is_custom) {
      // if this pass is considering custom JSON names, but neither of the
      // names involved in the conflict are custom, don't bother with a
      // message. That will have been reported from other pass (non-custom
      // JSON names).
      continue;
    }
    auto make_error = [&] {
      absl::string_view this_type = details.is_custom ? "custom" : "default";
      absl::string_view existing_type = match.is_custom ? "custom" : "default";
      // If the matched name differs (which it can only differ in case), include
      // it in the error message, for maximum clarity to user.
      std::string name_suffix = "";
      if (details.orig_name != match.orig_name) {
        name_suffix = absl::StrCat(" (\"", match.orig_name, "\")");
      }
      return absl::StrFormat(
          "The %s JSON name of field \"%s\" (\"%s\") conflicts "
          "with the %s JSON name of field \"%s\"%s.",
          this_type, field.name(), details.orig_name, existing_type,
          match.field->name(), name_suffix);
    };

    bool involves_default = !details.is_custom || !match.is_custom;
    if (descriptor->features().json_format() ==
            FeatureSet::LEGACY_BEST_EFFORT &&
        involves_default) {
      // TODO Upgrade this to an error once downstream protos
      // have been fixed.
      AddWarning(message_name, field, DescriptorPool::ErrorCollector::NAME,
                 make_error);
    } else {
      AddError(message_name, field, DescriptorPool::ErrorCollector::NAME,
               make_error);
    }
  }
}